

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O3

void __thiscall ManchesterAnalyzer::SynchronizeBiPhase(ManchesterAnalyzer *this)

{
  unsigned_long_long *puVar1;
  U32 UVar2;
  U32 UVar3;
  ManchesterMode MVar4;
  iterator iVar5;
  pointer ppVar6;
  pointer puVar7;
  unsigned_long_long *puVar8;
  long lVar9;
  ulong uVar10;
  unsigned_long_long *puVar11;
  unsigned_long_long *puVar12;
  ulong uVar13;
  int iVar14;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  U64 edge_location;
  unsigned_long_long *local_48;
  iterator iStack_40;
  unsigned_long_long *local_38;
  unsigned_long_long local_30;
  
  if (this->mSynchronized == false) {
    do {
      Analyzer::CheckIfThreadShouldExit();
      local_30 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar9 = AnalyzerChannelData::GetSampleNumber();
      uVar10 = lVar9 - local_30;
      UVar2 = this->mT;
      UVar3 = this->mTError;
      if (uVar10 < UVar3 + UVar2 && UVar2 - UVar3 < uVar10) {
        iVar5._M_current =
             (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                     &this->mUnsyncedLocations,iVar5,&local_30);
        }
        else {
          *iVar5._M_current = local_30;
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
      }
      else {
        if (uVar10 < UVar3 + UVar2 * 2 && UVar2 * 2 - UVar3 < uVar10) {
          iVar5._M_current =
               (this->mUnsyncedLocations).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
            _M_realloc_insert<unsigned_long_long_const&>
                      ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                       &this->mUnsyncedLocations,iVar5,&local_30);
            puVar12 = (this->mUnsyncedLocations).
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *iVar5._M_current = local_30;
            puVar12 = iVar5._M_current + 1;
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar12;
          }
          this->mSynchronized = true;
          MVar4 = ((this->mSettings)._M_ptr)->mMode;
          local_48 = (unsigned_long_long *)0x0;
          iStack_40._M_current = (unsigned_long_long *)0x0;
          local_38 = (unsigned_long_long *)0x0;
          puVar11 = (this->mUnsyncedLocations).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (puVar12 != puVar11) {
            do {
              if (iStack_40._M_current == local_38) {
                std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
                _M_realloc_insert<unsigned_long_long_const&>
                          ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                           &local_48,iStack_40,puVar12 + -1);
                puVar11 = (this->mUnsyncedLocations).
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (this->mUnsyncedLocations).
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                *iStack_40._M_current = puVar12[-1];
                iStack_40._M_current = iStack_40._M_current + 1;
              }
              iVar5._M_current = iStack_40._M_current;
              puVar8 = local_48;
              puVar1 = puVar12 + -1;
              puVar12 = puVar12 + -2;
              if (puVar1 == puVar11) {
                puVar12 = puVar1;
              }
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar12;
            } while (puVar12 != puVar11);
            if (local_48 != iStack_40._M_current) {
              uVar10 = (long)iStack_40._M_current - (long)local_48 >> 3;
              lVar9 = 0x3f;
              if (uVar10 != 0) {
                for (; uVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_48,iStack_40._M_current,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (puVar8,iVar5._M_current);
            }
          }
          uVar10 = (ulong)((long)iStack_40._M_current - (long)local_48) >> 3;
          iVar14 = (int)uVar10;
          if (iVar14 != 0) {
            uVar13 = 0;
            do {
              SaveBit(this,local_48[uVar13],
                      (uint)((iVar14 - 1 == uVar13) != (MVar4 == BI_PHASE_MARK)));
              uVar13 = uVar13 + 1;
            } while ((uVar10 & 0xffffffff) != uVar13);
          }
          if (local_48 == (unsigned_long_long *)0x0) {
            return;
          }
          operator_delete(local_48);
          return;
        }
        this->mSynchronized = false;
        ppVar6 = (this->mBitsForNextByte).
                 super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->mBitsForNextByte).
            super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppVar6) {
          (this->mBitsForNextByte).
          super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
        }
        puVar7 = (this->mUnsyncedLocations).
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if ((this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar7) {
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar7;
        }
        this->mIgnoreBitCount = ((this->mSettings)._M_ptr)->mBitsToIgnore;
      }
    } while (this->mSynchronized == false);
  }
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeBiPhase()
{
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;
            U32 bit_value = 0;
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                bit_value = 1;
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                bit_value = 0;

            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
            {
                if( i == ( count - 1 ) )
                    SaveBit( locations_to_save[ i ], bit_value ^ 0x1 );
                else
                    SaveBit( locations_to_save[ i ], bit_value );
            }
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}